

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall soul::heart::Parser::parseModuleStructs(Parser *this,ScannedTopLevelItem *item)

{
  Module *pMVar1;
  RefCountedPtr<soul::Structure> *this_00;
  Structure *s;
  pointer pUVar2;
  pointer pUVar3;
  size_t i;
  ulong i_00;
  UTF8Reader local_50;
  ArrayView<soul::RefCountedPtr<soul::Structure>_> local_48;
  UTF8Reader local_38;
  
  prepareToRescan(this,item);
  pMVar1 = pool_ptr<soul::Module>::operator->(&this->module);
  pUVar2 = (item->structBodyCode).
           super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
           super__Vector_impl_data._M_start;
  pUVar3 = (item->structBodyCode).
           super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pMVar1->structs).structs.numActive == (long)pUVar3 - (long)pUVar2 >> 3) {
    local_38.data =
         (this->
         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
         ).location.location.data;
    for (i_00 = 0; i_00 < (ulong)((long)pUVar3 - (long)pUVar2 >> 3); i_00 = i_00 + 1) {
      local_50.data = pUVar2[i_00].data;
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      resetPosition(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,&local_50);
      pMVar1 = pool_ptr<soul::Module>::operator->(&this->module);
      local_48.s = (pMVar1->structs).structs.items;
      local_48.e = local_48.s + (pMVar1->structs).structs.numActive;
      this_00 = ArrayView<soul::RefCountedPtr<soul::Structure>_>::operator[](&local_48,i_00);
      s = RefCountedPtr<soul::Structure>::operator*(this_00);
      parseStructBody(this,s);
      pUVar2 = (item->structBodyCode).
               super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
               super__Vector_impl_data._M_start;
      pUVar3 = (item->structBodyCode).
               super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    resetPosition(&this->
                   super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ,&local_38);
    (this->module).object = (Module *)0x0;
    return;
  }
  throwInternalCompilerError
            ("module->structs.size() == item.structBodyCode.size()","parseModuleStructs",0xd6);
}

Assistant:

void parseModuleStructs (ScannedTopLevelItem& item)
    {
        prepareToRescan (item);
        SOUL_ASSERT (module->structs.size() == item.structBodyCode.size());

        auto nextItemPos = getCurrentTokeniserPosition();

        for (size_t i = 0; i < item.structBodyCode.size(); ++i)
        {
            resetPosition (item.structBodyCode[i]);
            parseStructBody (*module->structs.get()[i]);
        }

        resetPosition (nextItemPos);
        module.reset();
    }